

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR moveto_union(lyxp_set *set1,lyxp_set *set2)

{
  ly_ctx *ctx;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  LY_ERR ret__;
  LY_ERR rc;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  if ((set1->type == LYXP_SET_NODE_SET) && (set2->type == LYXP_SET_NODE_SET)) {
    if (set2->used == 0) {
      set1_local._4_4_ = LY_SUCCESS;
    }
    else if (set1->used == 0) {
      lyxp_set_free_content(set1);
      memcpy(set1,set2,0x90);
      memset(set2,0,0x90);
      set1_local._4_4_ = LY_SUCCESS;
    }
    else {
      iVar1 = set_sort(set1);
      if ((iVar1 != 0) || (iVar1 = set_sort(set2), iVar1 != 0)) {
        __assert_fail("!set_sort(set1) && !set_sort(set2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x1bee,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
      }
      set1_local._4_4_ = set_sorted_merge(set1,set2);
      if (set1_local._4_4_ == LY_SUCCESS) {
        iVar1 = set_sort(set1);
        if (iVar1 != 0) {
          __assert_fail("!set_sort(set1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x1bf5,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
        }
        set1_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  else {
    ctx = set1->ctx;
    pcVar2 = print_set_type(set1);
    pcVar3 = print_set_type(set2);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s and %s.","union",
            pcVar2,pcVar3);
    set1_local._4_4_ = LY_EVALID;
  }
  return set1_local._4_4_;
}

Assistant:

static LY_ERR
moveto_union(struct lyxp_set *set1, struct lyxp_set *set2)
{
    LY_ERR rc;

    if ((set1->type != LYXP_SET_NODE_SET) || (set2->type != LYXP_SET_NODE_SET)) {
        LOGVAL(set1->ctx, LY_VCODE_XP_INOP_2, "union", print_set_type(set1), print_set_type(set2));
        return LY_EVALID;
    }

    /* set2 is empty or both set1 and set2 */
    if (!set2->used) {
        return LY_SUCCESS;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        /* dynamic memory belongs to set1 now, do not free */
        memset(set2, 0, sizeof *set2);
        return LY_SUCCESS;
    }

    /* we assume sets are sorted */
    assert(!set_sort(set1) && !set_sort(set2));

    /* sort, remove duplicates */
    rc = set_sorted_merge(set1, set2);
    LY_CHECK_RET(rc);

    /* final set must be sorted */
    assert(!set_sort(set1));

    return LY_SUCCESS;
}